

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O3

void __thiscall
chrono::ChGlyphs::SetGlyphPoint(ChGlyphs *this,uint id,ChVector<double> *mpoint,ChColor *mcolor)

{
  ChVector<double> *pCVar1;
  ChColor *pCVar2;
  float fVar3;
  pointer pCVar4;
  pointer pCVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar4 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)id;
  uVar7 = ((long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) *
          -0x5555555555555555;
  if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
    pCVar4 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar1 = pCVar4 + uVar6;
  if (pCVar1 != mpoint) {
    pCVar1->m_data[0] = mpoint->m_data[0];
    pCVar1->m_data[1] = mpoint->m_data[1];
    pCVar1->m_data[2] = mpoint->m_data[2];
  }
  pCVar5 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->colors).
                 super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar5 >> 2) * -0x5555555555555555;
  if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize
              (&this->colors,(ulong)(id + 1));
    pCVar5 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  pCVar2 = pCVar5 + uVar6;
  if (pCVar2 != mcolor) {
    fVar3 = mcolor->G;
    pCVar2->R = mcolor->R;
    pCVar2->G = fVar3;
    pCVar2->B = mcolor->B;
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphPoint(unsigned int id, ChVector<> mpoint, ChColor mcolor) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mpoint;

    if (colors.size() <= id)
        colors.resize(id + 1);
    colors[id] = mcolor;
}